

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t lzx_read_bitlen(lzx_stream *strm,huffman *d,wchar_t end)

{
  lzx_br *br;
  ushort uVar1;
  lzx_dec *plVar2;
  wchar_t wVar3;
  uint uVar4;
  wchar_t wVar5;
  long lVar6;
  int iVar7;
  uchar *puVar8;
  uint uVar9;
  ulong uVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  bool bVar13;
  
  plVar2 = strm->ds;
  wVar11 = plVar2->loop;
  if (wVar11 == L'\0') {
    d->freq[0xc] = L'\0';
    d->freq[0xd] = L'\0';
    d->freq[0xe] = L'\0';
    d->freq[0xf] = L'\0';
    d->freq[8] = L'\0';
    d->freq[9] = L'\0';
    d->freq[10] = L'\0';
    d->freq[0xb] = L'\0';
    d->freq[4] = L'\0';
    d->freq[5] = L'\0';
    d->freq[6] = L'\0';
    d->freq[7] = L'\0';
    d->freq[0] = L'\0';
    d->freq[1] = L'\0';
    d->freq[2] = L'\0';
    d->freq[3] = L'\0';
    d->freq[0x10] = L'\0';
  }
  if (end < L'\0') {
    end = d->len_size;
  }
  wVar5 = L'\x01';
  if (wVar11 < end) {
    br = &plVar2->br;
    do {
      plVar2->loop = wVar11;
      wVar5 = (plVar2->br).cache_avail;
      wVar12 = (plVar2->pt).max_bits;
      if (wVar5 < wVar12) {
        wVar3 = lzx_br_fillup(strm,br);
        wVar5 = (plVar2->br).cache_avail;
        wVar12 = (plVar2->pt).max_bits;
        if (wVar3 != L'\0' || wVar12 <= wVar5) goto LAB_003b26bb;
LAB_003b29db:
        wVar5 = L'\0';
        goto LAB_003b29dd;
      }
LAB_003b26bb:
      uVar1 = (plVar2->pt).tbl
              [(uint)((plVar2->br).cache_buffer >> ((char)wVar5 - (char)wVar12 & 0x3fU)) &
               cache_masks[wVar12]];
      uVar10 = (ulong)uVar1;
      if ((plVar2->pt).len_size <= (int)(uint)uVar1) {
        uVar10 = 0;
      }
      puVar8 = (plVar2->pt).bitlen;
      iVar7 = (int)uVar10;
      if (iVar7 == 0x13) {
        uVar4 = (uint)puVar8[0x13];
        if (wVar5 < wVar12 + (uint)puVar8[0x13] + L'\x01') {
          wVar5 = lzx_br_fillup(strm,br);
          puVar8 = (plVar2->pt).bitlen;
          if (wVar5 == L'\0') {
            wVar5 = (plVar2->br).cache_avail;
            uVar4 = (uint)puVar8[0x13];
            if (wVar5 < (plVar2->pt).max_bits + (uint)puVar8[0x13] + L'\x01') goto LAB_003b29db;
          }
          else {
            uVar4 = (uint)puVar8[0x13];
            wVar5 = (plVar2->br).cache_avail;
          }
        }
        (plVar2->br).cache_avail = wVar5 - uVar4;
        uVar10 = (plVar2->br).cache_buffer;
        wVar5 = (wVar5 - uVar4) + L'\xffffffff';
        bVar13 = (uVar10 >> ((ulong)(uint)wVar5 & 0x3f) & 1) != 0;
        if (end < (uint)bVar13 + wVar11 + L'\x04') {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar5;
        wVar12 = (plVar2->pt).max_bits;
        uVar1 = (plVar2->pt).tbl
                [(uint)(uVar10 >> ((char)wVar5 - (char)wVar12 & 0x3fU)) & cache_masks[wVar12]];
        uVar10 = (ulong)uVar1;
        if ((plVar2->pt).len_size <= (int)(uint)uVar1) {
          uVar10 = 0;
        }
        (plVar2->br).cache_avail = wVar5 - (uint)puVar8[uVar10];
        lVar6 = (long)wVar11;
        uVar4 = (int)(((uint)d->bitlen[lVar6] - (int)uVar10) + 0x11) % 0x11;
        if ((int)uVar4 < 0) {
          return L'\xffffffff';
        }
        uVar9 = (uint)bVar13;
        iVar7 = 0;
        do {
          d->bitlen[lVar6] = (uchar)uVar4;
          lVar6 = lVar6 + 1;
          iVar7 = iVar7 + -1;
        } while (-4 - uVar9 != iVar7);
        wVar11 = wVar11 - iVar7;
        d->freq[uVar4] = d->freq[uVar4] + (uVar9 | 4);
      }
      else if (iVar7 == 0x12) {
        uVar4 = (uint)puVar8[0x12];
        if (wVar5 < uVar4 + L'\x05') {
          wVar5 = lzx_br_fillup(strm,br);
          puVar8 = (plVar2->pt).bitlen;
          if (wVar5 == L'\0') {
            wVar5 = (plVar2->br).cache_avail;
            uVar4 = (uint)puVar8[0x12];
            if (wVar5 < uVar4 + L'\x05') goto LAB_003b29db;
          }
          else {
            uVar4 = (uint)puVar8[0x12];
            wVar5 = (plVar2->br).cache_avail;
          }
        }
        (plVar2->br).cache_avail = wVar5 - uVar4;
        wVar5 = (wVar5 - uVar4) + L'\xfffffffb';
        uVar4 = (uint)((plVar2->br).cache_buffer >> ((byte)wVar5 & 0x3f)) & 0x1f;
        wVar12 = uVar4 + wVar11 + L'\x14';
        if (end < wVar12) {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar5;
        memset(d->bitlen + wVar11,0,(ulong)(uVar4 + 0x14));
        wVar11 = wVar12;
      }
      else if (iVar7 == 0x11) {
        uVar4 = (uint)puVar8[0x11];
        if (wVar5 < uVar4 + L'\x04') {
          wVar5 = lzx_br_fillup(strm,br);
          puVar8 = (plVar2->pt).bitlen;
          if (wVar5 == L'\0') {
            wVar5 = (plVar2->br).cache_avail;
            uVar4 = (uint)puVar8[0x11];
            if (wVar5 < uVar4 + L'\x04') goto LAB_003b29db;
          }
          else {
            uVar4 = (uint)puVar8[0x11];
            wVar5 = (plVar2->br).cache_avail;
          }
        }
        (plVar2->br).cache_avail = wVar5 - uVar4;
        wVar5 = (wVar5 - uVar4) + L'\xfffffffc';
        uVar4 = (uint)((plVar2->br).cache_buffer >> ((byte)wVar5 & 0x3f)) & 0xf;
        if (end < uVar4 + wVar11 + L'\x04') {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar5;
        lVar6 = (long)wVar11;
        iVar7 = 0;
        do {
          d->bitlen[lVar6] = '\0';
          lVar6 = lVar6 + 1;
          iVar7 = iVar7 + -1;
        } while (-4 - uVar4 != iVar7);
        wVar11 = wVar11 - iVar7;
      }
      else {
        (plVar2->br).cache_avail = wVar5 - (uint)puVar8[uVar10];
        puVar8 = d->bitlen;
        uVar4 = (int)(((uint)puVar8[wVar11] - iVar7) + 0x11) % 0x11;
        if ((int)uVar4 < 0) {
          return L'\xffffffff';
        }
        d->freq[uVar4] = d->freq[uVar4] + L'\x01';
        puVar8[wVar11] = (uchar)uVar4;
        wVar11 = wVar11 + L'\x01';
      }
    } while (wVar11 < end);
    wVar5 = L'\x01';
  }
LAB_003b29dd:
  plVar2->loop = wVar11;
  return wVar5;
}

Assistant:

static int
lzx_read_bitlen(struct lzx_stream *strm, struct huffman *d, int end)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int c, i, j, ret, same;
	unsigned rbits;

	i = ds->loop;
	if (i == 0)
		memset(d->freq, 0, sizeof(d->freq));
	ret = 0;
	if (end < 0)
		end = d->len_size;
	while (i < end) {
		ds->loop = i;
		if (!lzx_br_read_ahead(strm, br, ds->pt.max_bits))
			goto getdata;
		rbits = lzx_br_bits(br, ds->pt.max_bits);
		c = lzx_decode_huffman(&(ds->pt), rbits);
		switch (c) {
		case 17:/* several zero lengths, from 4 to 19. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+4))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 4) + 4;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 4);
			for (j = 0; j < same; j++)
				d->bitlen[i++] = 0;
			break;
		case 18:/* many zero lengths, from 20 to 51. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+5))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 5) + 20;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 5);
			memset(d->bitlen + i, 0, same);
			i += same;
			break;
		case 19:/* a few same lengths. */
			if (!lzx_br_read_ahead(strm, br,
			    ds->pt.bitlen[c]+1+ds->pt.max_bits))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 1) + 4;
			if (i + same > end)
				return (-1);
			lzx_br_consume(br, 1);
			rbits = lzx_br_bits(br, ds->pt.max_bits);
			c = lzx_decode_huffman(&(ds->pt), rbits);
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			for (j = 0; j < same; j++)
				d->bitlen[i++] = c;
			d->freq[c] += same;
			break;
		default:
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			d->freq[c]++;
			d->bitlen[i++] = c;
			break;
		}
	}
	ret = 1;
getdata:
	ds->loop = i;
	return (ret);
}